

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineViewportDepthClampControlCreateInfoEXT *info,ScratchAllocator *alloc
          ,DynamicStateInfo *dynamic_state)

{
  VkPipelineViewportDepthClampControlCreateInfoEXT *pVVar1;
  VkDepthClampRangeEXT *pVVar2;
  VkPipelineViewportDepthClampControlCreateInfoEXT *clamp_control;
  DynamicStateInfo *dynamic_state_local;
  ScratchAllocator *alloc_local;
  VkPipelineViewportDepthClampControlCreateInfoEXT *info_local;
  Impl *this_local;
  
  pVVar1 = copy<VkPipelineViewportDepthClampControlCreateInfoEXT>(this,info,1,alloc);
  if ((((dynamic_state == (DynamicStateInfo *)0x0) || ((dynamic_state->depth_clamp_range & 1U) == 0)
       ) && (pVVar1->depthClampMode == VK_DEPTH_CLAMP_MODE_USER_DEFINED_RANGE_EXT)) &&
     (pVVar1->pDepthClampRange != (VkDepthClampRangeEXT *)0x0)) {
    pVVar2 = copy<VkDepthClampRangeEXT>(this,pVVar1->pDepthClampRange,1,alloc);
    pVVar1->pDepthClampRange = pVVar2;
  }
  else {
    pVVar1->pDepthClampRange = (VkDepthClampRangeEXT *)0x0;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineViewportDepthClampControlCreateInfoEXT *info, ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state)
{
	auto *clamp_control = copy(info, 1, alloc);
	if ((!dynamic_state || !dynamic_state->depth_clamp_range) &&
	    clamp_control->depthClampMode == VK_DEPTH_CLAMP_MODE_USER_DEFINED_RANGE_EXT &&
	    clamp_control->pDepthClampRange)
	{
		clamp_control->pDepthClampRange = copy(clamp_control->pDepthClampRange, 1, alloc);
	}
	else
		clamp_control->pDepthClampRange = nullptr;

	return clamp_control;
}